

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O1

ValueType * __thiscall
llbuild::buildsystem::BuildValue::toData(ValueType *__return_storage_ptr__,BuildValue *this)

{
  SmallVectorStorage<unsigned_char,_256U> *pSVar1;
  uint64_t uVar2;
  FileInfo *value;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  uint n;
  BinaryEncoder coder;
  BinaryEncoder local_140;
  
  pSVar1 = &local_140.encdata.super_SmallVectorStorage<unsigned_char,_256U>;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 0x100;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX = pSVar1;
  basic::BinaryEncoder::write<llbuild::buildsystem::BuildValue::Kind>(&local_140,&this->kind);
  __buf_01 = __buf;
  if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
     (__n = 0x20060, (0x20060U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    uVar2 = (this->signature).value;
    basic::BinaryEncoder::write(&local_140,(int)uVar2,__buf,0x20060);
    basic::BinaryEncoder::write(&local_140,(int)(uVar2 >> 0x20),__buf_00,__n);
    __buf_01 = extraout_RDX;
  }
  if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20414U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    basic::BinaryEncoder::write(&local_140,this->numOutputInfos,__buf_01,0x20414);
    if (this->numOutputInfos != 0) {
      n = 0;
      do {
        value = getNthOutputInfo(this,n);
        basic::BinaryCodingTraits<llbuild::basic::FileInfo>::encode(value,&local_140);
        n = n + 1;
      } while (n != this->numOutputInfos);
    }
  }
  if ((this->kind < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    basic::StringList::encode(&this->stringValues,&local_140);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_initialize<unsigned_char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             local_140.encdata.super_SmallVectorImpl<unsigned_char>.
             super_SmallVectorTemplateBase<unsigned_char,_true>.
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX,
             (AlignedCharArrayUnion<unsigned_char,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              *)local_140.encdata.super_SmallVectorImpl<unsigned_char>.
                super_SmallVectorTemplateBase<unsigned_char,_true>.
                super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX +
             (local_140.encdata.super_SmallVectorImpl<unsigned_char>.
              super_SmallVectorTemplateBase<unsigned_char,_true>.
              super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff));
  if ((SmallVectorStorage<unsigned_char,_256U> *)
      local_140.encdata.super_SmallVectorImpl<unsigned_char>.
      super_SmallVectorTemplateBase<unsigned_char,_true>.
      super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX != pSVar1) {
    free(local_140.encdata.super_SmallVectorImpl<unsigned_char>.
         super_SmallVectorTemplateBase<unsigned_char,_true>.
         super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

inline core::ValueType buildsystem::BuildValue::toData() const {
  basic::BinaryEncoder coder;
  coder.write(kind);
  if (kindHasSignature())
    coder.write(signature);
  if (kindHasOutputInfo()) {
    coder.write(numOutputInfos);
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.write(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues.encode(coder);
  }
  return coder.contents();
}